

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  _Rb_tree_header *p_Var9;
  ZipWriter zip_writer;
  FileOutputStream stream;
  ZipWriter local_90;
  FileOutputStream local_70;
  
  if (this->had_error_ == false) {
    do {
      iVar2 = open((filename->_M_dataplus)._M_p,0x241,0x1b6);
      if (-1 < iVar2) {
        io::FileOutputStream::FileOutputStream(&local_70,iVar2,-1);
        ZipWriter::ZipWriter(&local_90,(ZeroCopyOutputStream *)&local_70);
        p_Var7 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var9 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var7 != p_Var9) {
          do {
            ZipWriter::Write(&local_90,(string *)(p_Var7 + 1),(string *)(p_Var7 + 2));
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != p_Var9);
        }
        ZipWriter::WriteDirectory(&local_90);
        if (local_70.copying_output_.errno_ == 0) {
          bVar1 = io::FileOutputStream::Close(&local_70);
          bVar8 = true;
          if (bVar1) goto LAB_0022fcab;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                              filename->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          pcVar5 = strerror(local_70.copying_output_.errno_);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        else {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                              filename->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          pcVar5 = strerror(local_70.copying_output_.errno_);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        bVar8 = false;
LAB_0022fcab:
        ZipWriter::~ZipWriter(&local_90);
        io::FileOutputStream::~FileOutputStream(&local_70);
        return bVar8;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
    } while (iVar2 == 4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    pcVar5 = strerror(iVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const std::string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    std::cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (const auto& pair : files_) {
    zip_writer.Write(pair.first, pair.second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
    return false;
  }

  if (!stream.Close()) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
    return false;
  }

  return true;
}